

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O0

HostFew<Omega_h::Read<signed_char>,_4> *
Omega_h::mark_dead_ents
          (HostFew<Omega_h::Read<signed_char>,_4> *__return_storage_ptr__,Mesh *mesh,
          LOs *rails2edges,Read<signed_char> *rail_col_dirs)

{
  int iVar1;
  LO LVar2;
  Int IVar3;
  Read<signed_char> *local_2b0;
  undefined8 *local_210;
  Write<signed_char> local_208;
  Read<signed_char> local_1f8;
  int local_1e8;
  undefined1 local_1e1;
  Int dim_2;
  Read<int> local_1d0;
  int local_1c0;
  allocator local_1b9;
  Int dim_1;
  Write<signed_char> local_198;
  int local_188;
  allocator local_181;
  Int dim;
  Read<int> local_150;
  Read<signed_char> local_140;
  Write<signed_char> local_130;
  undefined1 local_120 [8];
  HostFew<Omega_h::Write<signed_char>,_4> writes;
  Read<signed_char> *rail_col_dirs_local;
  LOs *rails2edges_local;
  Mesh *mesh_local;
  HostFew<Omega_h::Read<signed_char>,_4> *reads;
  
  local_210 = (undefined8 *)local_120;
  writes.array_[3].shared_alloc_.direct_ptr = rail_col_dirs;
  do {
    *local_210 = 0;
    local_210[1] = 0;
    local_210 = local_210 + 2;
  } while ((void **)local_210 != &writes.array_[3].shared_alloc_.direct_ptr);
  Read<int>::Read(&local_150,rails2edges);
  LVar2 = Mesh::nedges(mesh);
  mark_image((Omega_h *)&local_140,&local_150,LVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&dim,"",&local_181);
  deep_copy<signed_char>((Omega_h *)&local_130,&local_140,(string *)&dim);
  Write<signed_char>::operator=
            ((Write<signed_char> *)&writes.array_[0].shared_alloc_.direct_ptr,&local_130);
  Write<signed_char>::~Write(&local_130);
  std::__cxx11::string::~string((string *)&dim);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  Read<signed_char>::~Read(&local_140);
  Read<int>::~Read(&local_150);
  for (local_188 = 2; iVar1 = local_188, IVar3 = Mesh::dim(mesh), iVar1 <= IVar3;
      local_188 = local_188 + 1) {
    LVar2 = Mesh::nents(mesh,local_188);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&dim_1,"",&local_1b9);
    Write<signed_char>::Write(&local_198,LVar2,'\0',(string *)&dim_1);
    Write<signed_char>::operator=
              ((Write<signed_char> *)&writes.array_[(long)local_188 + -1].shared_alloc_.direct_ptr,
               &local_198);
    Write<signed_char>::~Write(&local_198);
    std::__cxx11::string::~string((string *)&dim_1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  for (local_1c0 = Mesh::dim(mesh); 1 < local_1c0; local_1c0 = local_1c0 + -1) {
    Read<int>::Read(&local_1d0,rails2edges);
    Read<signed_char>::Read((Read<signed_char> *)&dim_2,rail_col_dirs);
    mark_dead_ents(mesh,&local_1d0,(Read<signed_char> *)&dim_2,local_1c0,
                   (Write<signed_char> *)
                   &writes.array_[(long)local_1c0 + -1].shared_alloc_.direct_ptr,
                   (Write<signed_char> *)
                   &writes.array_[(long)(local_1c0 + -1) + -1].shared_alloc_.direct_ptr);
    Read<signed_char>::~Read((Read<signed_char> *)&dim_2);
    Read<int>::~Read(&local_1d0);
  }
  local_1e1 = 0;
  local_2b0 = __return_storage_ptr__->array_;
  do {
    ((SharedAlloc *)&(local_2b0->write_).shared_alloc_.alloc)->alloc = (Alloc *)0x0;
    (local_2b0->write_).shared_alloc_.direct_ptr = (void *)0x0;
    local_2b0 = local_2b0 + 1;
  } while ((HostFew<Omega_h::Read<signed_char>,_4> *)local_2b0 != __return_storage_ptr__ + 1);
  for (local_1e8 = 0; local_1e8 < 4; local_1e8 = local_1e8 + 1) {
    Write<signed_char>::Write
              (&local_208,
               (Write<signed_char> *)&writes.array_[(long)local_1e8 + -1].shared_alloc_.direct_ptr);
    Read<signed_char>::Read(&local_1f8,&local_208);
    Read<signed_char>::operator=(__return_storage_ptr__->array_ + local_1e8,&local_1f8);
    Read<signed_char>::~Read(&local_1f8);
    Write<signed_char>::~Write(&local_208);
  }
  local_1e1 = 1;
  HostFew<Omega_h::Write<signed_char>,_4>::~HostFew
            ((HostFew<Omega_h::Write<signed_char>,_4> *)local_120);
  return __return_storage_ptr__;
}

Assistant:

HostFew<Read<I8>, 4> mark_dead_ents(
    Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs) {
  HostFew<Write<I8>, 4> writes;
  writes[EDGE] = deep_copy(mark_image(rails2edges, mesh->nedges()));
  for (Int dim = Int(EDGE) + 1; dim <= mesh->dim(); ++dim)
    writes[dim] = Write<I8>(mesh->nents(dim), 0);
  for (Int dim = mesh->dim(); dim > EDGE; --dim)
    mark_dead_ents(
        mesh, rails2edges, rail_col_dirs, dim, writes[dim], writes[dim - 1]);
  HostFew<Read<I8>, 4> reads;
  for (Int dim = 0; dim < 4; ++dim) reads[dim] = writes[dim];
  return reads;
}